

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ucnv_u32.cpp
# Opt level: O3

void T_UConverter_fromUnicode_UTF32_LE_OFFSET_LOGIC(UConverterFromUnicodeArgs *args,UErrorCode *err)

{
  uchar uVar1;
  char cVar2;
  UChar *pUVar3;
  uchar *targetLimit;
  int *piVar4;
  uchar *puVar5;
  int iVar6;
  uint uVar7;
  long lVar8;
  UConverter *pUVar9;
  UChar *pUVar10;
  uchar temp [4];
  
  pUVar10 = args->source;
  pUVar3 = args->sourceLimit;
  if (pUVar10 < pUVar3) {
    targetLimit = (uchar *)args->targetLimit;
    pUVar9 = args->converter;
    if (pUVar9->fromUnicodeStatus == 1) {
      ucnv_fromUWriteBytes_63
                (pUVar9,T_UConverter_fromUnicode_UTF32_LE_OFFSET_LOGIC::bom,4,&args->target,
                 (char *)targetLimit,&args->offsets,-1,err);
      pUVar9 = args->converter;
      pUVar9->fromUnicodeStatus = 0;
    }
    puVar5 = (uchar *)args->target;
    piVar4 = args->offsets;
    uVar7 = pUVar9->fromUChar32;
    if (uVar7 == 0) {
      iVar6 = 0;
      goto LAB_0016898e;
    }
    pUVar9->fromUChar32 = 0;
    iVar6 = 0;
    do {
      if (pUVar3 <= pUVar10) {
        args->converter->fromUChar32 = uVar7;
        if (args->flush != '\0') goto LAB_00168a75;
        goto LAB_00168a7c;
      }
      if (((ushort)*pUVar10 & 0xfc00) != 0xdc00) break;
      uVar7 = uVar7 * 0x400 + (uint)(ushort)*pUVar10 + 0xfca02400;
      pUVar10 = pUVar10 + 1;
      do {
        lVar8 = 0;
        do {
          uVar1 = temp[lVar8];
          if (puVar5 < targetLimit) {
            *puVar5 = uVar1;
            puVar5 = puVar5 + 1;
            *piVar4 = iVar6;
            piVar4 = piVar4 + 1;
          }
          else {
            pUVar9 = args->converter;
            cVar2 = pUVar9->charErrorBufferLength;
            pUVar9->charErrorBufferLength = cVar2 + '\x01';
            pUVar9->charErrorBuffer[cVar2] = uVar1;
            *err = U_BUFFER_OVERFLOW_ERROR;
          }
          lVar8 = lVar8 + 1;
        } while (lVar8 != 4);
        iVar6 = (iVar6 - (uint)((uVar7 & 0x1f0000) == 0)) + 2;
LAB_0016898e:
        if ((pUVar3 <= pUVar10) || (targetLimit <= puVar5)) goto LAB_00168a7c;
        uVar7 = (uint)(ushort)*pUVar10;
        pUVar10 = pUVar10 + 1;
      } while ((uVar7 & 0xf800) != 0xd800);
    } while ((uVar7 & 0xdc00) == 0xd800);
    args->converter->fromUChar32 = uVar7;
LAB_00168a75:
    *err = U_ILLEGAL_CHAR_FOUND;
LAB_00168a7c:
    if (((pUVar10 < pUVar3) && (targetLimit <= puVar5)) && (*err < U_ILLEGAL_ARGUMENT_ERROR)) {
      *err = U_BUFFER_OVERFLOW_ERROR;
    }
    args->target = (char *)puVar5;
    args->source = pUVar10;
    args->offsets = piVar4;
  }
  return;
}

Assistant:

static void U_CALLCONV
T_UConverter_fromUnicode_UTF32_LE_OFFSET_LOGIC(UConverterFromUnicodeArgs * args,
                                               UErrorCode * err)
{
    const UChar *mySource = args->source;
    unsigned char *myTarget;
    int32_t *myOffsets;
    const UChar *sourceLimit = args->sourceLimit;
    const unsigned char *targetLimit = (unsigned char *) args->targetLimit;
    UChar32 ch, ch2;
    unsigned int indexToWrite;
    unsigned char temp[sizeof(uint32_t)];
    int32_t offsetNum = 0;

    if(mySource >= sourceLimit) {
        /* no input, nothing to do */
        return;
    }

    /* write the BOM if necessary */
    if(args->converter->fromUnicodeStatus==UCNV_NEED_TO_WRITE_BOM) {
        static const char bom[]={ (char)0xffu, (char)0xfeu, 0, 0 };
        ucnv_fromUWriteBytes(args->converter,
                             bom, 4,
                             &args->target, args->targetLimit,
                             &args->offsets, -1,
                             err);
        args->converter->fromUnicodeStatus=0;
    }

    myTarget = (unsigned char *) args->target;
    myOffsets = args->offsets;
    temp[3] = 0;

    if (args->converter->fromUChar32)
    {
        ch = args->converter->fromUChar32;
        args->converter->fromUChar32 = 0;
        goto lowsurogate;
    }

    while (mySource < sourceLimit && myTarget < targetLimit)
    {
        ch = *(mySource++);

        if (U16_IS_SURROGATE(ch)) {
            if (U16_IS_LEAD(ch))
            {
lowsurogate:
                if (mySource < sourceLimit)
                {
                    ch2 = *mySource;
                    if (U16_IS_TRAIL(ch2))
                    {
                        ch = ((ch - SURROGATE_HIGH_START) << HALF_SHIFT) + ch2 + SURROGATE_LOW_BASE;
                        mySource++;
                    }
                    else {
                        /* this is an unmatched trail code unit (2nd surrogate) */
                        /* callback(illegal) */
                        args->converter->fromUChar32 = ch;
                        *err = U_ILLEGAL_CHAR_FOUND;
                        break;
                    }
                }
                else {
                    /* ran out of source */
                    args->converter->fromUChar32 = ch;
                    if (args->flush) {
                        /* this is an unmatched trail code unit (2nd surrogate) */
                        /* callback(illegal) */
                        *err = U_ILLEGAL_CHAR_FOUND;
                    }
                    break;
                }
            }
            else {
                /* this is an unmatched trail code unit (2nd surrogate) */
                /* callback(illegal) */
                args->converter->fromUChar32 = ch;
                *err = U_ILLEGAL_CHAR_FOUND;
                break;
            }
        }

        /* We cannot get any larger than 10FFFF because we are coming from UTF-16 */
        temp[2] = (uint8_t) (ch >> 16 & 0x1F);
        temp[1] = (uint8_t) (ch >> 8);  /* unsigned cast implicitly does (ch & FF) */
        temp[0] = (uint8_t) (ch);       /* unsigned cast implicitly does (ch & FF) */

        for (indexToWrite = 0; indexToWrite <= sizeof(uint32_t) - 1; indexToWrite++)
        {
            if (myTarget < targetLimit)
            {
                *(myTarget++) = temp[indexToWrite];
                *(myOffsets++) = offsetNum;
            }
            else
            {
                args->converter->charErrorBuffer[args->converter->charErrorBufferLength++] = temp[indexToWrite];
                *err = U_BUFFER_OVERFLOW_ERROR;
            }
        }
        offsetNum = offsetNum + 1 + (temp[2] != 0);
    }

    if (mySource < sourceLimit && myTarget >= targetLimit && U_SUCCESS(*err))
    {
        *err = U_BUFFER_OVERFLOW_ERROR;
    }

    args->target = (char *) myTarget;
    args->source = mySource;
    args->offsets = myOffsets;
}